

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int E_ExtLoop(int type,int si1,int sj1,vrna_param_t *P)

{
  int local_24;
  int energy;
  vrna_param_t *P_local;
  int sj1_local;
  int si1_local;
  int type_local;
  
  local_24 = 0;
  if ((si1 < 0) || (sj1 < 0)) {
    if (si1 < 0) {
      if (-1 < sj1) {
        local_24 = P->dangle3[type][sj1];
      }
    }
    else {
      local_24 = P->dangle5[type][si1];
    }
  }
  else {
    local_24 = P->mismatchExt[type][si1][sj1];
  }
  if (2 < type) {
    local_24 = P->TerminalAU + local_24;
  }
  return local_24;
}

Assistant:

PUBLIC int
E_ExtLoop(int           type,
          int           si1,
          int           sj1,
          vrna_param_t  *P)
{
  int energy = 0;

  if (si1 >= 0 && sj1 >= 0)
    energy += P->mismatchExt[type][si1][sj1];
  else if (si1 >= 0)
    energy += P->dangle5[type][si1];
  else if (sj1 >= 0)
    energy += P->dangle3[type][sj1];

  if (type > 2)
    energy += P->TerminalAU;

  return energy;
}